

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::GreaterThanTest<char,long>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_17;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_16;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_15;
  int local_14 [3];
  
  local_14[2] = 3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_15,local_14 + 2);
  if (local_15.m_int < '\x02') {
    local_14[1] = 4;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_16,local_14 + 1);
    if ('\x05' < local_16.m_int) {
      local_14[0] = 6;
      SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_17,local_14);
      return '\a' < local_17.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanTest()
	{
		return
			(U)2 > SafeInt<T>(3) &&
			SafeInt<T>(4) > (U)5 &&
			SafeInt<T>(6) > SafeInt<U>(7);
	}